

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall gimage::Histogram::sumCols(Histogram *this,Histogram *rowhist)

{
  int iVar1;
  unsigned_long **ppuVar2;
  unsigned_long **ppuVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  uint uVar6;
  long lVar7;
  unsigned_long uVar8;
  ulong uVar9;
  
  setSize(rowhist,this->h,1,this->bs);
  uVar6 = rowhist->h * rowhist->w;
  if (0 < (int)uVar6) {
    memset(rowhist->val,0,(ulong)uVar6 << 3);
  }
  iVar1 = this->h;
  if (0 < (long)iVar1) {
    uVar6 = this->w;
    ppuVar2 = this->row;
    ppuVar3 = rowhist->row;
    lVar7 = 0;
    do {
      if (0 < (int)uVar6) {
        puVar4 = ppuVar2[lVar7];
        puVar5 = ppuVar3[1];
        uVar8 = puVar5[lVar7];
        uVar9 = 0;
        do {
          uVar8 = uVar8 + puVar4[uVar9];
          puVar5[lVar7] = uVar8;
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void Histogram::sumCols(Histogram &rowhist) const
{
  rowhist.setSize(h, 1, bs);
  rowhist.clear();

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      rowhist(k, 1)+=row[k][i];
    }
  }
}